

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O3

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *__ptr;
  SharedData *pSVar1;
  
  pSVar1 = this->shared_;
  if (pSVar1->refcount == 0) {
    __assert_fail("shared_->refcount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/allocators.h"
                  ,0x116,
                  "void rapidjson::MemoryPoolAllocator<>::Clear() [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  while( true ) {
    __ptr = pSVar1->chunkHead;
    if (__ptr->next == (ChunkHeader *)0x0) break;
    pSVar1->chunkHead = __ptr->next;
    free(__ptr);
    pSVar1 = this->shared_;
  }
  __ptr->size = 0;
  return;
}

Assistant:

void Clear() RAPIDJSON_NOEXCEPT {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        for (;;) {
            ChunkHeader* c = shared_->chunkHead;
            if (!c->next) {
                break;
            }
            shared_->chunkHead = c->next;
            baseAllocator_->Free(c);
        }
        shared_->chunkHead->size = 0;
    }